

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDecompress.c
# Opt level: O0

USTATUS LzmaDecompress(void *Source,UINT32 SourceSize,void *Destination)

{
  SRes SVar1;
  ulong local_40;
  SizeT EncodedDataSize;
  SizeT DecodedBufSize;
  ELzmaStatus Status;
  SRes LzmaResult;
  void *Destination_local;
  Byte *pBStack_18;
  UINT32 SourceSize_local;
  void *Source_local;
  
  _Status = (Byte *)Destination;
  Destination_local._4_4_ = SourceSize;
  pBStack_18 = (Byte *)Source;
  EncodedDataSize = GetDecodedSizeOfBuf((UINT8 *)Source);
  local_40 = (ulong)(Destination_local._4_4_ - 0xd);
  SVar1 = LzmaDecode(_Status,&EncodedDataSize,pBStack_18 + 0xd,&local_40,pBStack_18,5,
                     LZMA_FINISH_END,(ELzmaStatus *)&DecodedBufSize,&SzAllocForLzma);
  Source_local = (void *)(ulong)(SVar1 != 0);
  return (USTATUS)Source_local;
}

Assistant:

USTATUS
EFIAPI
LzmaDecompress (
    CONST VOID  *Source,
    UINT32      SourceSize,
    VOID        *Destination
    )
{
    SRes              LzmaResult;
    ELzmaStatus       Status;
    SizeT             DecodedBufSize;
    SizeT             EncodedDataSize;

    DecodedBufSize = (SizeT)GetDecodedSizeOfBuf((UINT8*)Source);
    EncodedDataSize = (SizeT)(SourceSize - LZMA_HEADER_SIZE);

    LzmaResult = LzmaDecode(
        (Byte*)Destination,
        &DecodedBufSize,
        (Byte*)((UINT8*)Source + LZMA_HEADER_SIZE),
        &EncodedDataSize,
        (CONST Byte*) Source,
        LZMA_PROPS_SIZE,
        LZMA_FINISH_END,
        &Status,
        &SzAllocForLzma
        );

    if (LzmaResult == SZ_OK) {
        return U_SUCCESS;
    }
    else {
        return U_INVALID_PARAMETER;
    }
}